

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

void __thiscall sentencepiece::unigram::Model::Model(Model *this,ModelProto *model_proto)

{
  float fVar1;
  int iVar2;
  ModelProto *pMVar3;
  Rep *pRVar4;
  float fVar5;
  void **ppvVar6;
  long lVar7;
  __node_base *p_Var8;
  float fVar9;
  float fVar10;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  pieces;
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  local_38;
  
  ModelInterface::ModelInterface(&this->super_ModelInterface);
  (this->super_ModelInterface)._vptr_ModelInterface = (_func_int **)&PTR__Model_003b7770;
  this->encoder_version_ = kOptimized;
  this->min_score_ = 0.0;
  this->max_score_ = 0.0;
  (this->trie_)._M_t.
  super___uniq_ptr_impl<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
  .super__Head_base<0UL,_Darts::DoubleArrayImpl<void,_void,_int,_void>_*,_false>._M_head_impl =
       (DoubleArrayImpl<void,_void,_int,_void> *)0x0;
  (this->super_ModelInterface).model_proto_ = model_proto;
  ModelInterface::InitializePieces(&this->super_ModelInterface);
  this->min_score_ = 3.4028235e+38;
  this->max_score_ = 1.1754944e-38;
  pMVar3 = (this->super_ModelInterface).model_proto_;
  pRVar4 = (pMVar3->pieces_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  iVar2 = (pMVar3->pieces_).super_RepeatedPtrFieldBase.current_size_;
  fVar10 = 3.4028235e+38;
  fVar9 = 1.1754944e-38;
  for (lVar7 = 0; (long)iVar2 * 8 != lVar7; lVar7 = lVar7 + 8) {
    if (*(int *)(*(long *)((long)ppvVar6 + lVar7) + 0x3c) == 1) {
      fVar1 = *(float *)(*(long *)((long)ppvVar6 + lVar7) + 0x38);
      fVar5 = fVar1;
      if (fVar10 <= fVar1) {
        fVar5 = fVar10;
      }
      fVar10 = fVar5;
      this->min_score_ = fVar10;
      if (fVar1 <= fVar9) {
        fVar1 = fVar9;
      }
      fVar9 = fVar1;
      this->max_score_ = fVar9;
    }
  }
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = &(this->super_ModelInterface).pieces_._M_h._M_before_begin;
  while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
    std::
    vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
              ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                *)&local_38,(basic_string_view<char,_std::char_traits<char>_> *)(p_Var8 + 1),
               (int *)(p_Var8 + 3));
  }
  BuildTrie(this,(vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                  *)&local_38);
  std::
  _Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

Model::Model(const ModelProto &model_proto) {
  model_proto_ = &model_proto;

  InitializePieces();

  min_score_ = FLT_MAX;
  max_score_ = FLT_MIN;
  for (const auto &sp : model_proto_->pieces()) {
    if (sp.type() == ModelProto::SentencePiece::NORMAL) {
      min_score_ = std::min(min_score_, sp.score());
      max_score_ = std::max(max_score_, sp.score());
    }
  }

  std::vector<std::pair<absl::string_view, int>> pieces;
  for (const auto &it : pieces_) pieces.emplace_back(it.first, it.second);

  BuildTrie(&pieces);
}